

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

void wabt::anon_unknown_1::ResolveImplicitlyDefinedFunctionType
               (Location *loc,Module *module,FuncDeclaration *decl)

{
  pointer pFVar1;
  unique_ptr<wabt::FuncTypeModuleField,_std::default_delete<wabt::FuncTypeModuleField>_>
  local_48 [3];
  unique_ptr<wabt::FuncTypeModuleField,_std::default_delete<wabt::FuncTypeModuleField>_> local_30;
  unique_ptr<wabt::FuncTypeModuleField,_std::default_delete<wabt::FuncTypeModuleField>_>
  func_type_field;
  Index func_type_index;
  FuncDeclaration *decl_local;
  Module *module_local;
  Location *loc_local;
  
  if (((decl->has_func_type & 1U) == 0) &&
     (func_type_field._M_t.
      super___uniq_ptr_impl<wabt::FuncTypeModuleField,_std::default_delete<wabt::FuncTypeModuleField>_>
      ._M_t.
      super__Tuple_impl<0UL,_wabt::FuncTypeModuleField_*,_std::default_delete<wabt::FuncTypeModuleField>_>
      .super__Head_base<0UL,_wabt::FuncTypeModuleField_*,_false>._M_head_impl._4_4_ =
           Module::GetFuncTypeIndex(module,&decl->sig),
     func_type_field._M_t.
     super___uniq_ptr_impl<wabt::FuncTypeModuleField,_std::default_delete<wabt::FuncTypeModuleField>_>
     ._M_t.
     super__Tuple_impl<0UL,_wabt::FuncTypeModuleField_*,_std::default_delete<wabt::FuncTypeModuleField>_>
     .super__Head_base<0UL,_wabt::FuncTypeModuleField_*,_false>._M_head_impl._4_4_ == 0xffffffff)) {
    MakeUnique<wabt::FuncTypeModuleField,wabt::Location_const&>((wabt *)&local_30,loc);
    pFVar1 = std::
             unique_ptr<wabt::FuncTypeModuleField,_std::default_delete<wabt::FuncTypeModuleField>_>
             ::operator->(&local_30);
    FuncSignature::operator=(&(pFVar1->func_type).sig,&decl->sig);
    std::unique_ptr<wabt::FuncTypeModuleField,_std::default_delete<wabt::FuncTypeModuleField>_>::
    unique_ptr(local_48,&local_30);
    Module::AppendField(module,local_48);
    std::unique_ptr<wabt::FuncTypeModuleField,_std::default_delete<wabt::FuncTypeModuleField>_>::
    ~unique_ptr(local_48);
    std::unique_ptr<wabt::FuncTypeModuleField,_std::default_delete<wabt::FuncTypeModuleField>_>::
    ~unique_ptr(&local_30);
  }
  return;
}

Assistant:

void ResolveImplicitlyDefinedFunctionType(const Location& loc,
                                          Module* module,
                                          const FuncDeclaration& decl) {
  // Resolve implicitly defined function types, e.g.: (func (param i32) ...)
  if (!decl.has_func_type) {
    Index func_type_index = module->GetFuncTypeIndex(decl.sig);
    if (func_type_index == kInvalidIndex) {
      auto func_type_field = MakeUnique<FuncTypeModuleField>(loc);
      func_type_field->func_type.sig = decl.sig;
      module->AppendField(std::move(func_type_field));
    }
  }
}